

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fxstore(ASMState *as,IRIns *ir)

{
  IRIns IVar1;
  int iVar2;
  Reg rr;
  RegSet local_34;
  x86Op local_30;
  x86Op xo;
  RegSet allow8;
  int32_t k;
  Reg osrc;
  Reg src;
  RegSet allow;
  IRIns *ir_local;
  ASMState *as_local;
  
  osrc = 0xbfef;
  k = 0x80;
  allow8 = 0x80;
  xo = XOg_FADDq;
  if ((ir->field_1).r != 0xfe) {
    _src = ir;
    ir_local = (IRIns *)as;
    if ((((((ir->field_1).t.irt & 0x1f) == 0x11) || (((ir->field_1).t.irt & 0x1f) == 0x12)) ||
        (((ir->field_1).t.irt & 0x1f) == 0xe)) ||
       ((((ir->field_1).t.irt & 0x1f) == 0xd ||
        (iVar2 = asm_isk32(as,(uint)(ir->field_0).op2,(int32_t *)&xo), iVar2 == 0)))) {
      if ((((_src->field_1).t.irt & 0x1f) == 0xe) || (((_src->field_1).t.irt & 0x1f) == 0xd)) {
        local_34 = 0xffff0000;
      }
      else {
        local_34 = 0xbfef;
      }
      allow8 = ra_alloc1((ASMState *)&ir_local->field_0,(uint)(_src->field_0).op2,local_34);
      osrc = (1 << ((byte)allow8 & 0x1f) ^ 0xffffffffU) & osrc;
      k = allow8;
    }
    if ((_src->field_1).o == 'M') {
      asm_fusefref((ASMState *)&ir_local->field_0,
                   (IRIns *)((long)ir_local[0x12] + (ulong)(_src->field_0).op1 * 8),osrc);
    }
    else {
      asm_fusexref((ASMState *)&ir_local->field_0,(uint)(_src->field_0).op1,osrc);
    }
    if ((k & 0x80U) == 0) {
      switch((_src->field_1).t.irt & 0x1f) {
      case 0xd:
        local_30 = XO_MOVSSto;
        break;
      case 0xe:
        local_30 = XO_MOVSDto;
        break;
      case 0xf:
      case 0x10:
        local_30 = XO_MOVtob;
        k = k | 0x200;
        break;
      case 0x11:
      case 0x12:
        local_30 = XO_MOVtow;
        break;
      default:
        if ((0x605fd9U >> ((_src->field_1).t.irt & 0x1f) & 1) != 0) {
          k = k | 0x80200;
        }
        local_30 = XO_MOVto;
      }
      emit_mrm((ASMState *)&ir_local->field_0,local_30,k,0x20);
    }
    else if ((((_src->field_1).t.irt & 0x1f) == 0xf) || (((_src->field_1).t.irt & 0x1f) == 0x10)) {
      IVar1 = ir_local[0x10];
      ir_local[0x10] = (IRIns)(IVar1.field_0 + -1);
      *(char *)((long)IVar1 + -1) = (char)xo;
      emit_mrm((ASMState *)&ir_local->field_0,XO_MOVmib,0,0x20);
    }
    else {
      *(x86Op *)((long)ir_local[0x10] + -4) = xo;
      ir_local[0x10] = (IRIns)(ir_local[0x10] + -4);
      rr = 0;
      if ((0x605fd9U >> ((_src->field_1).t.irt & 0x1f) & 1) != 0) {
        rr = 0x80200;
      }
      emit_mrm((ASMState *)&ir_local->field_0,XO_MOVmi,rr,0x20);
    }
  }
  return;
}

Assistant:

static void asm_fxstore(ASMState *as, IRIns *ir)
{
  RegSet allow = RSET_GPR;
  Reg src = RID_NONE, osrc = RID_NONE;
  int32_t k = 0;
  if (ir->r == RID_SINK)
    return;
  /* The IRT_I16/IRT_U16 stores should never be simplified for constant
  ** values since mov word [mem], imm16 has a length-changing prefix.
  */
  if (irt_isi16(ir->t) || irt_isu16(ir->t) || irt_isfp(ir->t) ||
      !asm_isk32(as, ir->op2, &k)) {
    RegSet allow8 = irt_isfp(ir->t) ? RSET_FPR :
		    (irt_isi8(ir->t) || irt_isu8(ir->t)) ? RSET_GPR8 : RSET_GPR;
    src = osrc = ra_alloc1(as, ir->op2, allow8);
    if (!LJ_64 && !rset_test(allow8, src)) {  /* Already in wrong register. */
      rset_clear(allow, osrc);
      src = ra_scratch(as, allow8);
    }
    rset_clear(allow, src);
  }
  if (ir->o == IR_FSTORE) {
    asm_fusefref(as, IR(ir->op1), allow);
  } else {
    asm_fusexref(as, ir->op1, allow);
    if (LJ_32 && ir->o == IR_HIOP) as->mrm.ofs += 4;
  }
  if (ra_hasreg(src)) {
    x86Op xo;
    switch (irt_type(ir->t)) {
    case IRT_I8: case IRT_U8: xo = XO_MOVtob; src |= FORCE_REX; break;
    case IRT_I16: case IRT_U16: xo = XO_MOVtow; break;
    case IRT_NUM: xo = XO_MOVSDto; break;
    case IRT_FLOAT: xo = XO_MOVSSto; break;
#if LJ_64 && !LJ_GC64
    case IRT_LIGHTUD:
      /* NYI: mask 64 bit lightuserdata. */
      lj_assertA(0, "store of lightuserdata");
#endif
    default:
      if (LJ_64 && irt_is64(ir->t))
	src |= REX_64;
      else
	lj_assertA(irt_isint(ir->t) || irt_isu32(ir->t) || irt_isaddr(ir->t),
		   "unsplit 64 bit store");
      xo = XO_MOVto;
      break;
    }
    emit_mrm(as, xo, src, RID_MRM);
    if (!LJ_64 && src != osrc) {
      ra_noweak(as, osrc);
      emit_rr(as, XO_MOV, src, osrc);
    }
  } else {
    if (irt_isi8(ir->t) || irt_isu8(ir->t)) {
      emit_i8(as, k);
      emit_mrm(as, XO_MOVmib, 0, RID_MRM);
    } else {
      lj_assertA(irt_is64(ir->t) || irt_isint(ir->t) || irt_isu32(ir->t) ||
		 irt_isaddr(ir->t), "bad store type");
      emit_i32(as, k);
      emit_mrm(as, XO_MOVmi, REX_64IR(ir, 0), RID_MRM);
    }
  }
}